

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chr.cpp
# Opt level: O2

void duckdb::ChrOperator::GetCodepoint(int32_t input,char *c,int *utf8_bytes)

{
  bool bVar1;
  InvalidInputException *this;
  allocator local_41;
  string local_40;
  
  if (-1 < input) {
    bVar1 = Utf8Proc::CodepointToUtf8(input,utf8_bytes,c);
    if (bVar1) {
      return;
    }
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_40,"Invalid UTF8 Codepoint %d",&local_41);
  InvalidInputException::InvalidInputException<int>(this,&local_40,input);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void GetCodepoint(int32_t input, char c[], int &utf8_bytes) {
		if (input < 0 || !Utf8Proc::CodepointToUtf8(input, utf8_bytes, &c[0])) {
			throw InvalidInputException("Invalid UTF8 Codepoint %d", input);
		}
	}